

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O3

SpatialRigidBodyInertia * __thiscall
RigidBodyDynamics::Math::SpatialTransform::applyTranspose
          (SpatialRigidBodyInertia *__return_storage_ptr__,SpatialTransform *this,
          SpatialRigidBodyInertia *rbi)

{
  Scalar SVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  PointerType ptr;
  Vector3d E_T_mr;
  Vector3_t local_250;
  SpatialTransform *local_238;
  SpatialTransform *local_230;
  Scalar *local_228;
  SpatialTransform *local_220;
  undefined8 *local_218;
  Vector3d *local_210;
  undefined8 *local_200;
  undefined8 *local_1f8;
  Scalar local_1e8;
  Scalar SStack_1e0;
  Scalar local_1d8;
  Scalar local_1d0;
  Scalar local_1c8;
  Scalar local_1c0;
  Scalar local_1b8;
  Scalar SStack_1b0;
  Scalar local_1a8;
  Matrix3_t local_198;
  undefined8 local_148;
  double local_140;
  double local_138;
  double dStack_130;
  undefined8 local_128;
  double local_120;
  double local_118;
  double dStack_110;
  undefined8 local_108;
  undefined8 local_100;
  double local_f8;
  double local_f0;
  double dStack_e8;
  undefined8 local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  double local_b0;
  double local_a8;
  double dStack_a0;
  undefined8 local_98;
  double local_90;
  double local_88;
  double dStack_80;
  undefined8 local_78;
  undefined8 local_70;
  double local_68;
  double local_60;
  double dStack_58;
  undefined8 local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined8 local_30;
  
  local_230 = (SpatialTransform *)&rbi->h;
  local_210 = &this->r;
  local_218 = (undefined8 *)rbi->m;
  local_238 = this;
  Vector3_t::
  Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_250,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_238);
  SVar1 = rbi->m;
  local_1e8 = rbi->Ixx;
  SStack_1e0 = rbi->Iyx;
  local_228 = &local_1e8;
  local_1c8 = rbi->Iyy;
  local_1d8 = rbi->Izx;
  local_1c0 = rbi->Izy;
  local_1a8 = rbi->Izz;
  local_120 = (this->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0];
  dStack_110 = -local_120;
  local_218 = &local_70;
  local_70 = 0;
  local_50 = 0;
  local_118 = (this->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1];
  local_140 = (this->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2];
  local_138 = -local_118;
  dStack_130 = -local_140;
  local_30 = 0;
  dVar3 = (rbi->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0];
  dVar4 = (rbi->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1];
  dVar2 = (rbi->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[2];
  local_90 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[2] * dVar2 +
             (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[1] * dVar4 +
             (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[0] * dVar3;
  dStack_80 = -local_90;
  local_210 = (Vector3d *)&local_b8;
  local_b8 = 0;
  local_98 = 0;
  local_88 = dVar2 * (this->E).super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[5] +
             (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[4] * dVar4 +
             (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[3] * dVar3;
  local_b0 = dVar2 * (this->E).super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[8] +
             (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[7] * dVar4 +
             (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[6] * dVar3;
  local_a8 = -local_88;
  dStack_a0 = -local_b0;
  local_78 = 0;
  local_c8 = -local_250.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0];
  local_200 = &local_100;
  local_100 = 0;
  local_e0 = 0;
  local_f0 = -local_250.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1];
  dStack_e8 = -local_250.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
               .m_storage.m_data.array[2];
  local_d0 = local_250.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[1];
  local_f8 = local_250.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[2];
  local_d8 = local_250.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
  local_c0 = 0;
  local_1f8 = &local_148;
  local_148 = 0;
  local_128 = 0;
  local_108 = 0;
  local_230 = this;
  local_220 = this;
  local_1d0 = SStack_1e0;
  local_1b8 = local_1d8;
  SStack_1b0 = local_1c0;
  local_68 = local_140;
  local_60 = local_138;
  dStack_58 = dStack_130;
  local_48 = local_120;
  local_40 = local_118;
  local_38 = dStack_110;
  Matrix3_t::
  Matrix3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>>
            (&local_198,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>_>
              *)&local_238);
  __return_storage_ptr__->m = SVar1;
  (__return_storage_ptr__->h).super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_250.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  (__return_storage_ptr__->h).super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_250.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1];
  (__return_storage_ptr__->h).super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_250.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[2];
  __return_storage_ptr__->Ixx =
       local_198.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  __return_storage_ptr__->Iyx =
       local_198.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  __return_storage_ptr__->Iyy =
       local_198.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  __return_storage_ptr__->Izx =
       local_198.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  __return_storage_ptr__->Izy =
       local_198.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  __return_storage_ptr__->Izz =
       local_198.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[8];
  return __return_storage_ptr__;
}

Assistant:

SpatialRigidBodyInertia applyTranspose (const SpatialRigidBodyInertia &rbi) {
    Vector3d E_T_mr = E.transpose() * rbi.h + rbi.m * r;
    return SpatialRigidBodyInertia (
        rbi.m,
        E_T_mr,
        E.transpose() * 
        Matrix3d (
          rbi.Ixx, rbi.Iyx, rbi.Izx,
          rbi.Iyx, rbi.Iyy, rbi.Izy,
          rbi.Izx, rbi.Izy, rbi.Izz
          ) * E
        - VectorCrossMatrix(r) * VectorCrossMatrix (E.transpose() * rbi.h)  
        - VectorCrossMatrix (E_T_mr) * VectorCrossMatrix (r));
  }